

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geopolyAddOneSegment
               (GeoOverlap *p,GeoCoord x0,GeoCoord y0,GeoCoord x1,GeoCoord y1,uchar side,uint idx)

{
  int iVar1;
  int iVar2;
  GeoSegment *pGVar3;
  GeoEvent *pGVar4;
  GeoCoord GVar5;
  GeoCoord GVar6;
  double dVar7;
  
  if ((x0 == x1) && (!NAN(x0) && !NAN(x1))) {
    return;
  }
  GVar5 = x0;
  GVar6 = y0;
  if (x1 < x0) {
    GVar5 = x1;
    GVar6 = y1;
    x1 = x0;
    y1 = y0;
  }
  pGVar3 = p->aSegment;
  iVar1 = p->nSegment;
  p->nSegment = iVar1 + 1;
  dVar7 = (double)((y1 - GVar6) / (x1 - GVar5));
  pGVar3[iVar1].C = dVar7;
  pGVar3[iVar1].B = (double)y1 - dVar7 * (double)x1;
  pGVar3[iVar1].y0 = GVar6;
  pGVar3[iVar1].side = side;
  pGVar3[iVar1].idx = idx;
  pGVar4 = p->aEvent;
  iVar2 = p->nEvent;
  pGVar4[iVar2].x = (double)GVar5;
  pGVar4[iVar2].eType = 0;
  pGVar4[iVar2].pSeg = pGVar3 + iVar1;
  p->nEvent = iVar2 + 2;
  pGVar4[(long)iVar2 + 1].x = (double)x1;
  pGVar4[(long)iVar2 + 1].eType = 1;
  pGVar4[(long)iVar2 + 1].pSeg = pGVar3 + iVar1;
  return;
}

Assistant:

static void geopolyAddOneSegment(
  GeoOverlap *p,
  GeoCoord x0,
  GeoCoord y0,
  GeoCoord x1,
  GeoCoord y1,
  unsigned char side,
  unsigned int idx
){
  GeoSegment *pSeg;
  GeoEvent *pEvent;
  if( x0==x1 ) return;  /* Ignore vertical segments */
  if( x0>x1 ){
    GeoCoord t = x0;
    x0 = x1;
    x1 = t;
    t = y0;
    y0 = y1;
    y1 = t;
  }
  pSeg = p->aSegment + p->nSegment;
  p->nSegment++;
  pSeg->C = (y1-y0)/(x1-x0);
  pSeg->B = y1 - x1*pSeg->C;
  pSeg->y0 = y0;
  pSeg->side = side;
  pSeg->idx = idx;
  pEvent = p->aEvent + p->nEvent;
  p->nEvent++;
  pEvent->x = x0;
  pEvent->eType = 0;
  pEvent->pSeg = pSeg;
  pEvent = p->aEvent + p->nEvent;
  p->nEvent++;
  pEvent->x = x1;
  pEvent->eType = 1;
  pEvent->pSeg = pSeg;
}